

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o1.cc
# Opt level: O0

bool lf::geometry::assertNonDegenerateQuad(Matrix<double,__1,_4,_0,__1,_4> *coords,double tol)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Index IVar8;
  runtime_error *prVar9;
  CoeffReturnType pdVar10;
  ostream *this;
  allocator<char> local_1651;
  string local_1650;
  allocator<char> local_1629;
  string local_1628;
  allocator<char> local_1601;
  string local_1600;
  string local_15e0;
  allocator<char> local_15b9;
  string local_15b8;
  allocator<char> local_1591;
  string local_1590;
  stringstream local_1570 [8];
  stringstream ss_6;
  ostream local_1560 [376];
  string local_13e8;
  allocator<char> local_13c1;
  string local_13c0;
  allocator<char> local_1399;
  string local_1398;
  stringstream local_1378 [8];
  stringstream ss_5;
  ostream local_1368 [376];
  double local_11f0;
  double area_1;
  ConstColXpr local_11b8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>_>
  local_1188;
  ConstColXpr local_1120;
  ConstColXpr local_10f0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>_>
  local_10c0;
  type local_1058;
  RealScalar local_1040;
  double ar2_1;
  ConstColXpr local_1008;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>_>
  local_fd8;
  ConstColXpr local_f70;
  ConstColXpr local_f40;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>_>
  local_f10;
  type local_ea8;
  RealScalar local_e90;
  double ar1_1;
  Matrix<double,3,4,0,3,4> local_e58 [8];
  Matrix<double,_3,_4,_0,_3,_4> c3d;
  string local_df0;
  allocator<char> local_dc9;
  string local_dc8;
  allocator<char> local_da1;
  string local_da0;
  stringstream local_d80 [8];
  stringstream ss_4;
  ostream local_d70 [376];
  double local_bf8;
  double area;
  double ar2;
  double ar1;
  allocator<char> local_bb9;
  string local_bb8;
  allocator<char> local_b91;
  string local_b90;
  stringstream local_b70 [8];
  stringstream ss_3;
  ostream local_b60 [376];
  string local_9e8;
  allocator<char> local_9c1;
  string local_9c0;
  allocator<char> local_999;
  string local_998;
  stringstream local_978 [8];
  stringstream ss_2;
  ostream local_968 [376];
  string local_7f0;
  allocator<char> local_7c9;
  string local_7c8;
  allocator<char> local_7a1;
  string local_7a0;
  stringstream local_780 [8];
  stringstream ss_1;
  ostream local_770 [376];
  string local_5f8;
  allocator<char> local_5d1;
  string local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  stringstream local_578 [8];
  stringstream ss;
  ostream local_568 [376];
  double local_3f0;
  double circum;
  ConstColXpr local_3b0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
  local_378;
  RealScalar local_300;
  double e3lensq;
  ConstColXpr local_2c0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
  local_288;
  RealScalar local_210;
  double e2lensq;
  ConstColXpr local_1d0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
  local_198;
  RealScalar local_120;
  double e1lensq;
  ConstColXpr local_e0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
  local_a8;
  RealScalar local_30;
  double e0lensq;
  double dStack_20;
  dim_t wd;
  double tol_local;
  Matrix<double,__1,_4,_0,__1,_4> *coords_local;
  
  dStack_20 = tol;
  tol_local = (double)coords;
  IVar8 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::rows
                    (&coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>);
  e0lensq._4_4_ = (uint)IVar8;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            (&local_e0,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)tol_local,1);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            ((ConstColXpr *)&e1lensq,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)tol_local
             ,0);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>>::operator-
            (&local_a8,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>> *)&local_e0
             ,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
               *)&e1lensq);
  local_30 = Eigen::
             MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>_>
             ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>_>
                            *)&local_a8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            (&local_1d0,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)tol_local,2);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            ((ConstColXpr *)&e2lensq,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)tol_local
             ,1);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>>::operator-
            (&local_198,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>> *)
             &local_1d0,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_> *
             )&e2lensq);
  local_120 = Eigen::
              MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>_>
              ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>_>
                             *)&local_198);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            (&local_2c0,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)tol_local,3);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            ((ConstColXpr *)&e3lensq,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)tol_local
             ,2);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>>::operator-
            (&local_288,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>> *)
             &local_2c0,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_> *
             )&e3lensq);
  local_210 = Eigen::
              MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>_>
              ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>_>
                             *)&local_288);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            (&local_3b0,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)tol_local,0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            ((ConstColXpr *)&circum,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)tol_local,
             3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>>::operator-
            (&local_378,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>> *)
             &local_3b0,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_> *
             )&circum);
  local_300 = Eigen::
              MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>_>
              ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>_>
                             *)&local_378);
  local_3f0 = local_30 + local_120 + local_210 + local_300;
  if (local_30 <= dStack_20 * local_3f0) {
    std::__cxx11::stringstream::stringstream(local_578);
    std::operator<<(local_568,"Collapsed edge 0");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5a8,"e0lensq > tol * circum",&local_5a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5d0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,&local_5d1);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_5a8,&local_5d0,0x17,&local_5f8);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::__cxx11::string::~string((string *)&local_5d0);
    std::allocator<char>::~allocator(&local_5d1);
    std::__cxx11::string::~string((string *)&local_5a8);
    std::allocator<char>::~allocator(&local_5a9);
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"this code should not be reached");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_120 <= dStack_20 * local_3f0) {
    std::__cxx11::stringstream::stringstream(local_780);
    std::operator<<(local_770,"Collapsed edge 1");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7a0,"e1lensq > tol * circum",&local_7a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7c8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,&local_7c9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_7a0,&local_7c8,0x18,&local_7f0);
    std::__cxx11::string::~string((string *)&local_7f0);
    std::__cxx11::string::~string((string *)&local_7c8);
    std::allocator<char>::~allocator(&local_7c9);
    std::__cxx11::string::~string((string *)&local_7a0);
    std::allocator<char>::~allocator(&local_7a1);
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"this code should not be reached");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_210 <= dStack_20 * local_3f0) {
    std::__cxx11::stringstream::stringstream(local_978);
    std::operator<<(local_968,"Collapsed edge 2");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_998,"e2lensq > tol * circum",&local_999);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9c0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,&local_9c1);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_998,&local_9c0,0x19,&local_9e8);
    std::__cxx11::string::~string((string *)&local_9e8);
    std::__cxx11::string::~string((string *)&local_9c0);
    std::allocator<char>::~allocator(&local_9c1);
    std::__cxx11::string::~string((string *)&local_998);
    std::allocator<char>::~allocator(&local_999);
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"this code should not be reached");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (dStack_20 * local_3f0 < local_300) {
    if (e0lensq._4_4_ == 2) {
      pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)tol_local,0
                           ,1);
      dVar1 = *pdVar10;
      pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)tol_local,0
                           ,0);
      dVar2 = *pdVar10;
      pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)tol_local,1
                           ,2);
      dVar3 = *pdVar10;
      pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)tol_local,1
                           ,0);
      dVar4 = *pdVar10;
      pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)tol_local,1
                           ,1);
      dVar5 = *pdVar10;
      pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)tol_local,1
                           ,0);
      dVar6 = *pdVar10;
      pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)tol_local,0
                           ,2);
      dVar7 = *pdVar10;
      pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)tol_local,0
                           ,0);
      ar2 = (dVar1 - dVar2) * (dVar3 - dVar4) + -((dVar5 - dVar6) * (dVar7 - *pdVar10));
      pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)tol_local,0
                           ,3);
      dVar1 = *pdVar10;
      pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)tol_local,0
                           ,0);
      dVar2 = *pdVar10;
      pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)tol_local,1
                           ,2);
      dVar3 = *pdVar10;
      pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)tol_local,1
                           ,0);
      dVar4 = *pdVar10;
      pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)tol_local,1
                           ,3);
      dVar5 = *pdVar10;
      pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)tol_local,1
                           ,0);
      dVar6 = *pdVar10;
      pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)tol_local,0
                           ,2);
      dVar7 = *pdVar10;
      pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)tol_local,0
                           ,0);
      area = (dVar1 - dVar2) * (dVar3 - dVar4) + -((dVar5 - dVar6) * (dVar7 - *pdVar10));
      local_bf8 = ABS(ar2) + ABS(area);
      if (local_bf8 <= dStack_20 * local_3f0) {
        std::__cxx11::stringstream::stringstream(local_d80);
        std::operator<<(local_d70,"Degenerate 2D quad");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_da0,"area > tol * circum",&local_da1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_dc8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                   ,&local_dc9);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_da0,&local_dc8,0x25,&local_df0);
        std::__cxx11::string::~string((string *)&local_df0);
        std::__cxx11::string::~string((string *)&local_dc8);
        std::allocator<char>::~allocator(&local_dc9);
        std::__cxx11::string::~string((string *)&local_da0);
        std::allocator<char>::~allocator(&local_da1);
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,"this code should not be reached");
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      if (e0lensq._4_4_ != 3) {
        std::__cxx11::stringstream::stringstream(local_1570);
        this = std::operator<<(local_1560,"Illegal world dimension");
        std::ostream::operator<<(this,e0lensq._4_4_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1590,"false",&local_1591);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_15b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                   ,&local_15b9);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_1590,&local_15b8,0x35,&local_15e0);
        std::__cxx11::string::~string((string *)&local_15e0);
        std::__cxx11::string::~string((string *)&local_15b8);
        std::allocator<char>::~allocator(&local_15b9);
        std::__cxx11::string::~string((string *)&local_1590);
        std::allocator<char>::~allocator(&local_1591);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1600,"false",&local_1601);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1628,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                   ,&local_1629);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1650,"",&local_1651);
        lf::base::AssertionFailed(&local_1600,&local_1628,0x35,&local_1650);
        std::__cxx11::string::~string((string *)&local_1650);
        std::allocator<char>::~allocator(&local_1651);
        std::__cxx11::string::~string((string *)&local_1628);
        std::allocator<char>::~allocator(&local_1629);
        std::__cxx11::string::~string((string *)&local_1600);
        std::allocator<char>::~allocator(&local_1601);
        abort();
      }
      Eigen::DenseBase<Eigen::Matrix<double,-1,4,0,-1,4>>::block<3,4>
                ((Type *)&ar1_1,(void *)tol_local,0,0);
      Eigen::Matrix<double,3,4,0,3,4>::
      Matrix<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,3,4,false>>
                (local_e58,
                 (Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,_3,_4,_false> *)&ar1_1);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::col
                (&local_f40,(DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)local_e58,1);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::col
                (&local_f70,(DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)local_e58,0);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>const,3,1,true>>::operator-
                (&local_f10,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>const,3,1,true>> *)
                 &local_f40,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>_>
                  *)&local_f70);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::col
                (&local_1008,(DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)local_e58,2);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::col
                ((ConstColXpr *)&ar2_1,(DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)local_e58
                 ,0);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>const,3,1,true>>::operator-
                (&local_fd8,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>const,3,1,true>> *)
                 &local_1008,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>_>
                  *)&ar2_1);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>const,3,1,true>const,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>const,3,1,true>const>>
      ::
      cross<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>const,3,1,true>const,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>const,3,1,true>const>>
                (&local_ea8,&local_f10,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>_>_>
                  *)&local_fd8);
      local_e90 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_ea8);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::col
                (&local_10f0,(DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)local_e58,3);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::col
                (&local_1120,(DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)local_e58,0);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>const,3,1,true>>::operator-
                (&local_10c0,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>const,3,1,true>> *)
                 &local_10f0,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>_>
                  *)&local_1120);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::col
                (&local_11b8,(DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)local_e58,2);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::col
                ((ConstColXpr *)&area_1,
                 (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)local_e58,0);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>const,3,1,true>>::operator-
                (&local_1188,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>const,3,1,true>> *)
                 &local_11b8,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>_>
                  *)&area_1);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>const,3,1,true>const,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>const,3,1,true>const>>
      ::
      cross<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>const,3,1,true>const,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>const,3,1,true>const>>
                (&local_1058,&local_10c0,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>_>_>
                  *)&local_1188);
      local_1040 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                             ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_1058);
      local_11f0 = local_e90 + local_1040;
      if (local_11f0 <= dStack_20 * local_3f0) {
        std::__cxx11::stringstream::stringstream(local_1378);
        std::operator<<(local_1368,"Degenerate 3D quad");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1398,"area > tol * circum",&local_1399);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_13c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                   ,&local_13c1);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_1398,&local_13c0,0x30,&local_13e8);
        std::__cxx11::string::~string((string *)&local_13e8);
        std::__cxx11::string::~string((string *)&local_13c0);
        std::allocator<char>::~allocator(&local_13c1);
        std::__cxx11::string::~string((string *)&local_1398);
        std::allocator<char>::~allocator(&local_1399);
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,"this code should not be reached");
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    return true;
  }
  std::__cxx11::stringstream::stringstream(local_b70);
  std::operator<<(local_b60,"Collapsed edge 3");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b90,"e3lensq > tol * circum",&local_b91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bb8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
             ,&local_bb9);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_b90,&local_bb8,0x1a,(string *)&ar1);
  std::__cxx11::string::~string((string *)&ar1);
  std::__cxx11::string::~string((string *)&local_bb8);
  std::allocator<char>::~allocator(&local_bb9);
  std::__cxx11::string::~string((string *)&local_b90);
  std::allocator<char>::~allocator(&local_b91);
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar9,"this code should not be reached");
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool assertNonDegenerateQuad(
    const Eigen::Matrix<double, Eigen::Dynamic, 4>& coords, double tol) {
  // World dimension
  const Geometry::dim_t wd = coords.rows();
  // Length tests
  const double e0lensq = (coords.col(1) - coords.col(0)).squaredNorm();
  const double e1lensq = (coords.col(2) - coords.col(1)).squaredNorm();
  const double e2lensq = (coords.col(3) - coords.col(2)).squaredNorm();
  const double e3lensq = (coords.col(0) - coords.col(3)).squaredNorm();
  // Test lengths of edges versus circumference.
  const double circum = e0lensq + e1lensq + e2lensq + e3lensq;
  LF_VERIFY_MSG(e0lensq > tol * circum, "Collapsed edge 0");
  LF_VERIFY_MSG(e1lensq > tol * circum, "Collapsed edge 1");
  LF_VERIFY_MSG(e2lensq > tol * circum, "Collapsed edge 2");
  LF_VERIFY_MSG(e3lensq > tol * circum, "Collapsed edge 3");
  // Area test
  switch (wd) {
    case 2: {
      const double ar1 =
          ((coords(0, 1) - coords(0, 0)) * (coords(1, 2) - coords(1, 0)) -
           (coords(1, 1) - coords(1, 0)) * (coords(0, 2) - coords(0, 0)));
      const double ar2 =
          ((coords(0, 3) - coords(0, 0)) * (coords(1, 2) - coords(1, 0)) -
           (coords(1, 3) - coords(1, 0)) * (coords(0, 2) - coords(0, 0)));
      const double area = std::fabs(ar1) + std::fabs(ar2);
      LF_VERIFY_MSG(area > tol * circum, "Degenerate 2D quad");
      return true;
      break;
    }
    case 3: {
      const Eigen::Matrix<double, 3, 4> c3d(coords.block<3, 4>(0, 0));
      const double ar1 =
          ((c3d.col(1) - c3d.col(0)).cross(c3d.col(2) - c3d.col(0))).norm();
      const double ar2 =
          ((c3d.col(3) - c3d.col(0)).cross(c3d.col(2) - c3d.col(0))).norm();
      const double area = ar1 + ar2;
      LF_VERIFY_MSG(area > tol * circum, "Degenerate 3D quad");
      return true;
      break;
    }
    default: {
      LF_ASSERT_MSG(false, "Illegal world dimension" << wd);
      break;
    }
  }
  return false;
}